

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O0

QString * formatLogMessage(QtMsgType type,QMessageLogContext *context,QString *str)

{
  char *pcVar1;
  QLatin1StringView str_00;
  QLatin1StringView str_01;
  QLatin1StringView str_02;
  QLatin1StringView str_03;
  QLatin1StringView str_04;
  QLatin1StringView str_05;
  QLatin1StringView str_06;
  QLatin1StringView str_07;
  QLatin1StringView str_08;
  QLatin1StringView str_09;
  QLatin1StringView str_10;
  bool bVar2;
  Type *backtraceParams_00;
  duration time;
  type ppcVar3;
  type tVar4;
  long in_RDX;
  int in_ESI;
  QString *in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  char *token;
  int i;
  int backtraceArgsIdx;
  int timeArgsIdx;
  bool skip;
  QMessagePattern *pattern;
  QString *message;
  QString timeFormat;
  anon_class_1_0_00000001 formatElapsedTime;
  scoped_lock<QBasicMutex> locker;
  BacktraceParams backtraceParams;
  int in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc5c;
  undefined4 in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  duration in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  int in_stack_fffffffffffffc74;
  undefined1 **in_stack_fffffffffffffc78;
  undefined1 *in_stack_fffffffffffffc80;
  QThread *in_stack_fffffffffffffc88;
  anon_class_1_0_00000001 *in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  QDateTime *in_stack_fffffffffffffca0;
  QLatin1StringView in_stack_fffffffffffffd20;
  QLatin1StringView in_stack_fffffffffffffd30;
  undefined1 local_48 [32];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString((QString *)0x246151);
  (anonymous_namespace)::qt_scoped_lock<QBasicMutex,std::scoped_lock<QBasicMutex>>
            ((QBasicMutex *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  backtraceParams_00 =
       QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
       operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                   *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
  if (backtraceParams_00 == (Type *)0x0) {
    QString::append((QString *)in_stack_fffffffffffffc68.__r,
                    (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  }
  else {
    bVar5 = false;
    while (time.__r = (rep)std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::
                           operator[]((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>
                                       *)CONCAT44(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60),
                                      CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
          , *(char **)time.__r != (char *)0x0) {
      ppcVar3 = std::unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_>::operator[]
                          ((unique_ptr<const_char_*[],_std::default_delete<const_char_*[]>_> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
      pcVar1 = *ppcVar3;
      if (pcVar1 == "%{endif}") {
        bVar5 = false;
      }
      else if (!bVar5) {
        if (pcVar1 == "%{message}") {
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        }
        else if (pcVar1 == "%{category}") {
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (char *)in_stack_fffffffffffffc68.__r);
          str_00.m_size._4_4_ = in_stack_fffffffffffffc74;
          str_00.m_size._0_4_ = in_stack_fffffffffffffc70;
          str_00.m_data = (char *)in_stack_fffffffffffffc78;
          QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                          str_00);
        }
        else if (pcVar1 == "%{type}") {
          switch(in_ESI) {
          case 0:
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_01.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_01.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_01.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_01);
            break;
          case 1:
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_03.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_03.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_03.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_03);
            break;
          case 2:
            in_stack_fffffffffffffd30 =
                 Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffc68.__r,
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_04.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_04.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_04.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_04);
            break;
          case 3:
            in_stack_fffffffffffffd20 =
                 Qt::Literals::StringLiterals::operator____L1
                           ((char *)in_stack_fffffffffffffc68.__r,
                            CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_05.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_05.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_05.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_05);
            break;
          case 4:
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_02.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_02.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_02.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_02);
          }
        }
        else if (pcVar1 == "%{file}") {
          if (*(long *)(in_RDX + 8) == 0) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_07.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_07.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_07.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_07);
          }
          else {
            QLatin1String::QLatin1String
                      ((QLatin1String *)
                       CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                       (char *)in_stack_fffffffffffffc68.__r);
            str_06.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_06.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_06.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_06);
          }
        }
        else if (pcVar1 == "%{line}") {
          QString::number(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58);
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x2465f1);
        }
        else if (pcVar1 == "%{function}") {
          if (*(long *)(in_RDX + 0x10) == 0) {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            str_08.m_size._4_4_ = in_stack_fffffffffffffc74;
            str_08.m_size._0_4_ = in_stack_fffffffffffffc70;
            str_08.m_data = (char *)in_stack_fffffffffffffc78;
            QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58)
                            ,str_08);
          }
          else {
            QByteArray::QByteArray
                      ((QByteArray *)in_stack_fffffffffffffc90,(char *)in_stack_fffffffffffffc88,
                       (qsizetype)in_stack_fffffffffffffc80);
            qCleanupFuncinfo((QByteArray *)backtraceParams_00);
            QString::fromLatin1<void>
                      ((QByteArray *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            QString::append((QString *)in_stack_fffffffffffffc68.__r,
                            (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                           );
            QString::~QString((QString *)0x2466b9);
            QByteArray::~QByteArray((QByteArray *)0x2466c6);
            QByteArray::~QByteArray((QByteArray *)0x2466d3);
          }
        }
        else if (pcVar1 == "%{pid}") {
          QCoreApplication::applicationPid();
          QString::number((qlonglong)in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x2467e2);
        }
        else if (pcVar1 == "%{appname}") {
          QCoreApplication::applicationName();
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x246852);
        }
        else if (pcVar1 == "%{threadid}") {
          in_stack_fffffffffffffca0 = (QDateTime *)qt_gettid();
          QString::number(in_stack_fffffffffffffc68.__r,in_stack_fffffffffffffc64);
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x2468d8);
        }
        else if (pcVar1 == "%{threadname}") {
          in_stack_fffffffffffffc9f =
               qt_append_thread_name_to((QString *)in_stack_fffffffffffffc68.__r);
          if (!(bool)in_stack_fffffffffffffc9f) {
            in_stack_fffffffffffffc90 = (anon_class_1_0_00000001 *)qt_gettid();
            QString::number(in_stack_fffffffffffffc68.__r,in_stack_fffffffffffffc64);
            QString::append((QString *)in_stack_fffffffffffffc68.__r,
                            (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60)
                           );
            QString::~QString((QString *)0x24697c);
          }
        }
        else if (pcVar1 == "%{qthreadptr}") {
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffc68.__r,
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          str_09.m_size._4_4_ = in_stack_fffffffffffffc74;
          str_09.m_size._0_4_ = in_stack_fffffffffffffc70;
          str_09.m_data = (char *)in_stack_fffffffffffffc78;
          QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                          str_09);
          QThread::currentThread();
          in_stack_fffffffffffffc88 = QThread::currentThread();
          QString::number((qlonglong)in_stack_fffffffffffffc78,in_stack_fffffffffffffc74);
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x246a4c);
        }
        else if (pcVar1 == "%{backtrace") {
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
          QList<QMessagePattern::BacktraceParams>::at
                    ((QList<QMessagePattern::BacktraceParams> *)
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          in_stack_fffffffffffffc78 = &local_28;
          QMessagePattern::BacktraceParams::BacktraceParams
                    ((BacktraceParams *)
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     (BacktraceParams *)
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          in_stack_fffffffffffffc80 = local_48;
          QMessagePattern::BacktraceParams::BacktraceParams
                    ((BacktraceParams *)
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                     (BacktraceParams *)
                     CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          formatBacktraceForLogMessage
                    ((BacktraceParams *)backtraceParams_00,(QMessageLogContext *)time.__r);
          QString::append((QString *)in_stack_fffffffffffffc68.__r,
                          (QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          QString::~QString((QString *)0x246b40);
          QMessagePattern::BacktraceParams::~BacktraceParams((BacktraceParams *)0x246b4d);
          QMessagePattern::BacktraceParams::~BacktraceParams((BacktraceParams *)0x246b5a);
        }
        else if (pcVar1 == "%{time") {
          QList<QString>::at((QList<QString> *)
                             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                             CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
          QString::QString((QString *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           (QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58))
          ;
          Qt::Literals::StringLiterals::operator____L1
                    ((char *)in_stack_fffffffffffffc68.__r,
                     CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          bVar2 = operator==((QString *)in_stack_fffffffffffffc68.__r,
                             (QLatin1StringView *)
                             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
          if (bVar2) {
            std::chrono::_V2::steady_clock::now();
            tVar4 = std::chrono::operator-
                              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                               (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
            in_stack_fffffffffffffc70 = (undefined4)tVar4.__r;
            in_stack_fffffffffffffc74 = (int)((ulong)tVar4.__r >> 0x20);
            formatLogMessage::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffc90,time);
            QString::operator+=((QString *)
                                CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
            QString::~QString((QString *)0x246cff);
          }
          else {
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_fffffffffffffc68.__r,
                       CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            bVar2 = operator==((QString *)in_stack_fffffffffffffc68.__r,
                               (QLatin1StringView *)
                               CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
            if (bVar2) {
              std::chrono::_V2::steady_clock::now();
              in_stack_fffffffffffffc68 =
                   std::chrono::
                   time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ::time_since_epoch((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)CONCAT44(in_stack_fffffffffffffc64,
                                                  in_stack_fffffffffffffc60));
              formatLogMessage::anon_class_1_0_00000001::operator()(in_stack_fffffffffffffc90,time);
              QString::operator+=((QString *)
                                  CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                                  (QString *)
                                  CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
              QString::~QString((QString *)0x246df8);
            }
            else {
              bVar2 = QString::isEmpty((QString *)0x246e34);
              if (bVar2) {
                QDateTime::currentDateTime();
                QDateTime::toString((QDateTime *)in_stack_fffffffffffffd30.m_size,
                                    in_stack_fffffffffffffd20.m_data._4_4_);
                QString::append((QString *)in_stack_fffffffffffffc68.__r,
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                QString::~QString((QString *)0x246e89);
                QDateTime::~QDateTime((QDateTime *)0x246e96);
              }
              else {
                QDateTime::currentDateTime();
                QDateTime::toString(in_stack_fffffffffffffca0,
                                    (QString *)
                                    CONCAT17(in_stack_fffffffffffffc9f,in_stack_fffffffffffffc98));
                QString::append((QString *)in_stack_fffffffffffffc68.__r,
                                (QString *)
                                CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
                QString::~QString((QString *)0x246f3b);
                QDateTime::~QDateTime((QDateTime *)0x246f48);
              }
            }
          }
          QString::~QString((QString *)0x246fa9);
        }
        else if (pcVar1 == "%{if-category}") {
          bVar2 = isDefaultCategory((char *)CONCAT44(in_stack_fffffffffffffc64,
                                                     in_stack_fffffffffffffc60));
          in_stack_fffffffffffffc64 = CONCAT13(bVar2,(int3)in_stack_fffffffffffffc64);
          if (bVar2) {
            bVar5 = true;
          }
        }
        else if (pcVar1 == "%{if-debug}") {
          bVar5 = in_ESI != 0;
        }
        else if (pcVar1 == "%{if-info}") {
          bVar5 = in_ESI != 4;
        }
        else if (pcVar1 == "%{if-warning}") {
          bVar5 = in_ESI != 1;
        }
        else if (pcVar1 == "%{if-critical}") {
          bVar5 = in_ESI != 2;
        }
        else if (pcVar1 == "%{if-fatal}") {
          bVar5 = in_ESI != 3;
        }
        else {
          QLatin1String::QLatin1String
                    ((QLatin1String *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     (char *)in_stack_fffffffffffffc68.__r);
          str_10.m_size._4_4_ = in_stack_fffffffffffffc74;
          str_10.m_size._0_4_ = in_stack_fffffffffffffc70;
          str_10.m_data = (char *)in_stack_fffffffffffffc78;
          QString::append((QString *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58),
                          str_10);
        }
      }
    }
  }
  std::scoped_lock<QBasicMutex>::~scoped_lock((scoped_lock<QBasicMutex> *)0x24715e);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString formatLogMessage(QtMsgType type, const QMessageLogContext &context, const QString &str)
{
    QString message;

    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    QMessagePattern *pattern = qMessagePattern();
    if (!pattern) {
        // after destruction of static QMessagePattern instance
        message.append(str);
        return message;
    }

    bool skip = false;

    int timeArgsIdx = 0;
#ifdef QLOGGING_HAVE_BACKTRACE
    int backtraceArgsIdx = 0;
#endif

    // we do not convert file, function, line literals to local encoding due to overhead
    for (int i = 0; pattern->tokens[i]; ++i) {
        const char *token = pattern->tokens[i];
        if (token == endifTokenC) {
            skip = false;
        } else if (skip) {
            // we skip adding messages, but we have to iterate over
            // timeArgsIdx and backtraceArgsIdx anyway
            if (token == timeTokenC)
                timeArgsIdx++;
#ifdef QLOGGING_HAVE_BACKTRACE
            else if (token == backtraceTokenC)
                backtraceArgsIdx++;
#endif
        } else if (token == messageTokenC) {
            message.append(str);
        } else if (token == categoryTokenC) {
            message.append(QLatin1StringView(context.category));
        } else if (token == typeTokenC) {
            switch (type) {
            case QtDebugMsg:   message.append("debug"_L1); break;
            case QtInfoMsg:    message.append("info"_L1); break;
            case QtWarningMsg: message.append("warning"_L1); break;
            case QtCriticalMsg:message.append("critical"_L1); break;
            case QtFatalMsg:   message.append("fatal"_L1); break;
            }
        } else if (token == fileTokenC) {
            if (context.file)
                message.append(QLatin1StringView(context.file));
            else
                message.append("unknown"_L1);
        } else if (token == lineTokenC) {
            message.append(QString::number(context.line));
        } else if (token == functionTokenC) {
            if (context.function)
                message.append(QString::fromLatin1(qCleanupFuncinfo(context.function)));
            else
                message.append("unknown"_L1);
        } else if (token == pidTokenC) {
            message.append(QString::number(QCoreApplication::applicationPid()));
        } else if (token == appnameTokenC) {
            message.append(QCoreApplication::applicationName());
        } else if (token == threadidTokenC) {
            // print the TID as decimal
            message.append(QString::number(qt_gettid()));
        } else if (token == threadnameTokenC) {
            if (!qt_append_thread_name_to(message))
                message.append(QString::number(qt_gettid())); // fallback to the TID
        } else if (token == qthreadptrTokenC) {
            message.append("0x"_L1);
            message.append(QString::number(qlonglong(QThread::currentThread()->currentThread()), 16));
#ifdef QLOGGING_HAVE_BACKTRACE
        } else if (token == backtraceTokenC) {
            QMessagePattern::BacktraceParams backtraceParams = pattern->backtraceArgs.at(backtraceArgsIdx);
            backtraceArgsIdx++;
            message.append(formatBacktraceForLogMessage(backtraceParams, context));
#endif
        } else if (token == timeTokenC) {
            using namespace std::chrono;
            auto formatElapsedTime = [](steady_clock::duration time) {
                // we assume time > 0
                auto ms = duration_cast<milliseconds>(time);
                auto sec = duration_cast<seconds>(ms);
                ms -= sec;
                return QString::asprintf("%6lld.%03u", qint64(sec.count()), uint(ms.count()));
            };
            QString timeFormat = pattern->timeArgs.at(timeArgsIdx);
            timeArgsIdx++;
            if (timeFormat == "process"_L1) {
                message += formatElapsedTime(steady_clock::now() - pattern->appStartTime);
            } else if (timeFormat == "boot"_L1) {
                // just print the milliseconds since the elapsed timer reference
                // like the Linux kernel does
                message += formatElapsedTime(steady_clock::now().time_since_epoch());
#if QT_CONFIG(datestring)
            } else if (timeFormat.isEmpty()) {
                message.append(QDateTime::currentDateTime().toString(Qt::ISODate));
            } else {
                message.append(QDateTime::currentDateTime().toString(timeFormat));
#endif // QT_CONFIG(datestring)
            }
        } else if (token == ifCategoryTokenC) {
            if (isDefaultCategory(context.category))
                skip = true;
#define HANDLE_IF_TOKEN(LEVEL)  \
        } else if (token == if##LEVEL##TokenC) { \
            skip = type != Qt##LEVEL##Msg;
        HANDLE_IF_TOKEN(Debug)
        HANDLE_IF_TOKEN(Info)
        HANDLE_IF_TOKEN(Warning)
        HANDLE_IF_TOKEN(Critical)
        HANDLE_IF_TOKEN(Fatal)
#undef HANDLE_IF_TOKEN
        } else {
            message.append(QLatin1StringView(token));
        }
    }
    return message;
}